

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

Mio_Cell_t * Mio_CollectRootsNew(Mio_Library_t *pLib,int nInputs,int *pnGates,int fVerbose)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  void *__ptr;
  Mio_Cell_t *pCell_00;
  float fVar7;
  uint local_6c;
  Mio_Cell_t *pCell;
  int *pCounts;
  int Idx_1;
  int Idx;
  int iCell;
  int nGates;
  int i;
  Mio_Cell_t *ppCells;
  Mio_Gate_t *pGate;
  int fVerbose_local;
  int *pnGates_local;
  int nInputs_local;
  Mio_Library_t *pLib_local;
  
  Idx_1 = 4;
  iVar5 = Mio_LibraryReadGateNum(pLib);
  pLib_local = (Mio_Library_t *)calloc((long)(iVar5 + 4),0x30);
  ppCells = (Mio_Cell_t *)Mio_LibraryReadGates(pLib);
  do {
    if (ppCells == (Mio_Cell_t *)0x0) {
      if (pLib_local->pName == (char *)0x0) {
        printf("Error: Cannot find constant 0 gate in the library.\n");
        pLib_local = (Mio_Library_t *)0x0;
      }
      else if (pLib_local->pGate1 == (Mio_Gate_t *)0x0) {
        printf("Error: Cannot find constant 1 gate in the library.\n");
        pLib_local = (Mio_Library_t *)0x0;
      }
      else if (pLib_local->pGateOr2 == (Mio_Gate_t *)0x0) {
        printf("Error: Cannot find buffer gate in the library.\n");
        pLib_local = (Mio_Library_t *)0x0;
      }
      else if (pLib_local->vTtMem == (Vec_Mem_t *)0x0) {
        printf("Error: Cannot find inverter gate in the library.\n");
        pLib_local = (Mio_Library_t *)0x0;
      }
      else {
        if (5 < Idx_1) {
          qsort(&pLib_local->vTt2Match4,(long)(Idx_1 + -4),0x30,Mio_AreaCompare);
          iVar6 = Mio_AreaCompare((Mio_Cell_t *)&pLib_local->vTt2Match4,
                                  (Mio_Cell_t *)((long)pLib_local + (long)Idx_1 * 0x30 + -0x30));
          if (0 < iVar6) {
            __assert_fail("Mio_AreaCompare( ppCells + 4, ppCells + iCell - 1 ) <= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x241,"Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)"
                         );
          }
        }
        for (iCell = 0; iCell < Idx_1; iCell = iCell + 1) {
          if ((&pLib_local->pName)[(long)iCell * 6] == (char *)0x0) {
            local_6c = 0xffffffff;
          }
          else {
            local_6c = iCell;
          }
          (&pLib_local->nGates)[(long)iCell * 0xc] =
               (&pLib_local->nGates)[(long)iCell * 0xc] & 0xf0000000U | local_6c & 0xfffffff;
        }
        if (fVerbose != 0) {
          __ptr = calloc((long)(iVar5 + 4),4);
          for (ppCells = (Mio_Cell_t *)Mio_LibraryReadGates(pLib); ppCells != (Mio_Cell_t *)0x0;
              ppCells = (Mio_Cell_t *)Mio_GateReadNext((Mio_Gate_t *)ppCells)) {
            if ((*(int *)((long)&ppCells[1].uTruth + 4) <= nInputs) &&
               (*(long *)&ppCells[1].field_0x8 == 0)) {
              for (iCell = 0; iCell < Idx_1; iCell = iCell + 1) {
                if (((&pLib_local->pName)[(long)iCell * 6] != (char *)0x0) &&
                   ((&pLib_local->ppGates0)[(long)iCell * 6] ==
                    *(Mio_Gate_t ***)&ppCells[2].field_0x8)) {
                  *(int *)((long)__ptr + (long)iCell * 4) =
                       *(int *)((long)__ptr + (long)iCell * 4) + 1;
                  break;
                }
              }
              if (Idx_1 <= iCell) {
                __assert_fail("i < iCell",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                              ,0x256,
                              "Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)");
              }
            }
          }
          for (iCell = 0; iCell < Idx_1; iCell = iCell + 1) {
            pCell_00 = (Mio_Cell_t *)(&pLib_local->pName + (long)iCell * 6);
            printf("%4d : ",(ulong)(uint)iCell);
            if (pCell_00->pName == (char *)0x0) {
              printf("None\n");
            }
            else {
              pcVar4 = pCell_00->pName;
              uVar2 = *(uint *)&pCell_00->field_0x8;
              uVar3 = *(uint *)((long)__ptr + (long)iCell * 4);
              fVar1 = pCell_00->Area;
              fVar7 = Mio_CellDelayAve(pCell_00);
              printf("%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n",(double)fVar1,
                     (double)fVar7,pcVar4,(ulong)(uVar2 >> 0x1c),(ulong)uVar3);
            }
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        if (pnGates != (int *)0x0) {
          *pnGates = Idx_1;
        }
      }
      return (Mio_Cell_t *)pLib_local;
    }
    if ((*(int *)((long)&ppCells[1].uTruth + 4) <= nInputs) && (*(long *)&ppCells[1].field_0x8 == 0)
       ) {
      for (iCell = 0; iCell < Idx_1; iCell = iCell + 1) {
        if (((&pLib_local->pName)[(long)iCell * 6] != (char *)0x0) &&
           ((&pLib_local->ppGates0)[(long)iCell * 6] == *(Mio_Gate_t ***)&ppCells[2].field_0x8)) {
          iVar6 = Mio_CompareTwo((Mio_Cell_t *)(&pLib_local->pName + (long)iCell * 6),
                                 (Mio_Gate_t *)ppCells);
          if (iVar6 != 0) {
            Mio_CollectCopy((Mio_Cell_t *)(&pLib_local->pName + (long)iCell * 6),
                            (Mio_Gate_t *)ppCells);
          }
          break;
        }
      }
      if (Idx_1 <= iCell) {
        if ((*(long *)&ppCells[2].field_0x8 == 0) || (*(long *)&ppCells[2].field_0x8 == -1)) {
          if (*(int *)((long)&ppCells[1].uTruth + 4) != 0) {
            __assert_fail("pGate->nInputs == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x227,"Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)"
                         );
          }
          Mio_CollectCopy((Mio_Cell_t *)
                          (&pLib_local->pName +
                          (long)(int)(uint)(*(long *)&ppCells[2].field_0x8 == -1) * 6),
                          (Mio_Gate_t *)ppCells);
        }
        else if ((*(long *)&ppCells[2].field_0x8 == -0x5555555555555556) ||
                (*(long *)&ppCells[2].field_0x8 == 0x5555555555555555)) {
          if (*(int *)((long)&ppCells[1].uTruth + 4) != 1) {
            __assert_fail("pGate->nInputs == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x22e,"Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)"
                         );
          }
          Mio_CollectCopy((Mio_Cell_t *)
                          (&pLib_local->pName +
                          (long)(int)((*(long *)&ppCells[2].field_0x8 == 0x5555555555555555) + 2) *
                          6),(Mio_Gate_t *)ppCells);
        }
        else {
          Mio_CollectCopy((Mio_Cell_t *)(&pLib_local->pName + (long)Idx_1 * 6),(Mio_Gate_t *)ppCells
                         );
          Idx_1 = Idx_1 + 1;
        }
      }
    }
    ppCells = (Mio_Cell_t *)Mio_GateReadNext((Mio_Gate_t *)ppCells);
  } while( true );
}

Assistant:

Mio_Cell_t * Mio_CollectRootsNew( Mio_Library_t * pLib, int nInputs, int * pnGates, int fVerbose )
{
    Mio_Gate_t * pGate;
    Mio_Cell_t * ppCells;
    int i, nGates, iCell = 4;
    nGates = Mio_LibraryReadGateNum( pLib );
    ppCells = ABC_CALLOC( Mio_Cell_t, nGates + 4 );
    // for each functionality, select gate with the smallest area
    // if equal areas, select gate with smaller average pin delay
    // if these are also equal, select lexicographically smaller name
    Mio_LibraryForEachGate( pLib, pGate )
    {
        if ( pGate->nInputs > nInputs || pGate->pTwin ) // skip large and multi-output
            continue;
        // check if the gate with this functionality already exists
        for ( i = 0; i < iCell; i++ )
            if ( ppCells[i].pName && ppCells[i].uTruth == pGate->uTruth )
            {
                if ( Mio_CompareTwo( ppCells + i, pGate ) )
                    Mio_CollectCopy( ppCells + i, pGate );
                break;
            }
        if ( i < iCell )
            continue;
        if ( pGate->uTruth == 0 || pGate->uTruth == ~(word)0 )
        {
            int Idx = (int)(pGate->uTruth == ~(word)0);
            assert( pGate->nInputs == 0 );
            Mio_CollectCopy( ppCells + Idx, pGate );
            continue;
        }
        if ( pGate->uTruth == ABC_CONST(0xAAAAAAAAAAAAAAAA) || pGate->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA) )
        {
            int Idx = 2 + (int)(pGate->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA));
            assert( pGate->nInputs == 1 );
            Mio_CollectCopy( ppCells + Idx, pGate );
            continue;
        }
        Mio_CollectCopy( ppCells + iCell++, pGate );
    }
    if ( ppCells[0].pName == NULL )
        { printf( "Error: Cannot find constant 0 gate in the library.\n" ); return NULL; }
    if ( ppCells[1].pName == NULL )
        { printf( "Error: Cannot find constant 1 gate in the library.\n" ); return NULL; }
    if ( ppCells[2].pName == NULL )
        { printf( "Error: Cannot find buffer gate in the library.\n" );     return NULL; }
    if ( ppCells[3].pName == NULL )
        { printf( "Error: Cannot find inverter gate in the library.\n" );   return NULL; }
    // sort by delay
    if ( iCell > 5 ) 
    {
        qsort( (void *)(ppCells + 4), (size_t)(iCell - 4), sizeof(Mio_Cell_t), 
                (int (*)(const void *, const void *)) Mio_AreaCompare );
        assert( Mio_AreaCompare( ppCells + 4, ppCells + iCell - 1 ) <= 0 );
    }
    // assign IDs
    for ( i = 0; i < iCell; i++ )
        ppCells[i].Id = ppCells[i].pName ? i : -1;

    // report
    if ( fVerbose )
    {
        // count gates
        int * pCounts = ABC_CALLOC( int, nGates + 4 );
        Mio_LibraryForEachGate( pLib, pGate )
        {
            if ( pGate->nInputs > nInputs || pGate->pTwin ) // skip large and multi-output
                continue;
            for ( i = 0; i < iCell; i++ )
                if ( ppCells[i].pName && ppCells[i].uTruth == pGate->uTruth )
                {
                    pCounts[i]++;
                    break;
                }
            assert( i < iCell );
        }
        for ( i = 0; i < iCell; i++ )
        {
            Mio_Cell_t * pCell = ppCells + i;
            printf( "%4d : ", i );
            if ( pCell->pName == NULL )
                printf( "None\n" );
            else
                printf( "%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n", 
                    pCell->pName, pCell->nFanins, pCounts[i], pCell->Area, Mio_CellDelayAve(pCell) );
        }
        ABC_FREE( pCounts );
    }
    if ( pnGates )
        *pnGates = iCell;
    return ppCells;
}